

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int matchshreg(match *res,reg *reg,expr *expr,int shl,disctx *ctx)

{
  int iVar1;
  ull sh;
  expr **ppeVar2;
  ulong uVar3;
  
  sh = 0;
  do {
    if (expr->type == EXPR_MUL) {
      if (expr->expr2->type == EXPR_NUM) {
        uVar3 = expr->expr2->num1;
        if ((uVar3 ^ uVar3 - 1) <= uVar3 - 1) {
          return 0;
        }
        for (; uVar3 != 1; uVar3 = uVar3 >> 1) {
          sh = sh + 1;
        }
        goto LAB_0016dd6d;
      }
      if (expr->expr1->type != EXPR_NUM) {
LAB_0016ddd0:
        if (sh != (long)shl) {
          return 0;
        }
        iVar1 = matchreg(res,reg,expr,ctx);
        return iVar1;
      }
      uVar3 = expr->expr1->num1;
      if ((uVar3 ^ uVar3 - 1) <= uVar3 - 1) {
        return 0;
      }
      ppeVar2 = &expr->expr2;
      for (; uVar3 != 1; uVar3 = uVar3 >> 1) {
        sh = sh + 1;
      }
    }
    else {
      if ((expr->type != EXPR_SHL) || (expr->expr2->type != EXPR_NUM)) goto LAB_0016ddd0;
      sh = sh + expr->expr2->num1;
LAB_0016dd6d:
      ppeVar2 = &expr->expr1;
    }
    expr = *ppeVar2;
  } while( true );
}

Assistant:

int matchshreg (struct match *res, const struct reg *reg, const struct expr *expr, int shl, struct disctx *ctx) {
	ull sh = 0;
	while (1) {
		if (expr->type == EXPR_SHL && expr->expr2->type == EXPR_NUM) {
			sh += expr->expr2->num1;
			expr = expr->expr1;
		} else if (expr->type == EXPR_MUL && expr->expr2->type == EXPR_NUM) {
			ull num = expr->expr2->num1;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->expr1;
		} else if (expr->type == EXPR_MUL && expr->expr1->type == EXPR_NUM) {
			ull num = expr->expr1->num1;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->expr2;
		} else {
			break;
		}
	}
	if (sh != shl)
		return 0;
	return matchreg(res, reg, expr, ctx);
}